

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
SharedPtrTests_misc_Reset_Test::~SharedPtrTests_misc_Reset_Test
          (SharedPtrTests_misc_Reset_Test *this)

{
  SharedPtrTests_misc_Reset_Test *this_local;
  
  ~SharedPtrTests_misc_Reset_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SharedPtrTests_misc, Reset) {
	int* a;
	int* b;
	a = new int;
	b = new int;
	*a = 1234;
	*b = 5678;
	SharedPtr<int> t1(a);
	SharedPtr<int> t2(t1);
	t1.reset(b);
	EXPECT_EQ(t1.get(), b);
	EXPECT_EQ(t2.get(), a);
	EXPECT_EQ(t1.use_count(), 1);
	EXPECT_EQ(t2.use_count(), 1);
}